

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ics_impl.cpp
# Opt level: O0

void __thiscall ui::anon_unknown_0::ICSImpl::ICSImpl(ICSImpl *this)

{
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l_00;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l_01;
  Ref<ftxui::ButtonOption> option;
  Ref<ftxui::ButtonOption> option_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_4b8;
  shared_ptr<ftxui::ComponentBase> *local_4a0;
  shared_ptr<ftxui::ComponentBase> *local_488;
  allocator<std::shared_ptr<ftxui::ComponentBase>_> local_424;
  undefined1 local_423;
  allocator<std::shared_ptr<ftxui::ComponentBase>_> local_422;
  undefined1 local_421;
  Ref<ftxui::InputOption> local_420;
  ConstStringRef local_3b8;
  StringRef local_390;
  Ref<ftxui::InputOption> local_368;
  ConstStringRef local_300;
  StringRef local_2d8;
  Ref<ftxui::InputOption> local_2b0;
  ConstStringRef local_248;
  StringRef local_220;
  ftxui *local_1f8;
  undefined1 local_1f0 [32];
  ftxui local_1d0 [16];
  shared_ptr<ftxui::ComponentBase> local_1c0;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_1b0;
  allocator<std::shared_ptr<ftxui::ComponentBase>_> local_192;
  undefined1 local_191;
  Ref<ftxui::ButtonOption> local_190;
  anon_class_8_1_8991fb9c local_180;
  function<void_()> local_178;
  ConstStringRef local_158;
  Ref<ftxui::ButtonOption> local_130;
  anon_class_8_1_8991fb9c local_120;
  function<void_()> local_118;
  ConstStringRef local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_98;
  Container *local_80;
  undefined1 local_78 [32];
  shared_ptr<ftxui::ComponentBase> local_58;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_48;
  Component local_30 [2];
  ICSImpl *local_10;
  ICSImpl *this_local;
  
  local_10 = this;
  PanelBase::PanelBase(&this->super_PanelBase);
  (this->super_PanelBase).super_ComponentBase._vptr_ComponentBase =
       (_func_int **)&PTR__ICSImpl_00218278;
  this->route_add_ = true;
  std::__cxx11::string::string((string *)&this->gateway_str);
  std::__cxx11::string::string((string *)&this->dns_1_str);
  std::__cxx11::string::string((string *)&this->dns_2_str);
  LoadConfig(this);
  local_423 = 1;
  local_80 = (Container *)local_78;
  local_191 = 1;
  local_d0 = &local_c8;
  ftxui::ConstStringRef::ConstStringRef(&local_f8,"ICS On");
  local_120.this = this;
  std::function<void()>::function<ui::(anonymous_namespace)::ICSImpl::ICSImpl()::_lambda()_1_,void>
            ((function<void()> *)&local_118,&local_120);
  ftxui::Ref<ftxui::ButtonOption>::Ref(&local_130);
  option.address_._0_1_ = local_130.owned_.border;
  option.address_._1_3_ = local_130._1_3_;
  option._0_8_ = &local_118;
  option.address_._4_4_ = 0;
  ftxui::Button((ConstStringRef *)&local_c8,(function<void_()> *)&local_f8,option);
  local_d0 = &local_b8;
  ftxui::ConstStringRef::ConstStringRef(&local_158,"ICS Off");
  local_180.this = this;
  std::function<void()>::function<ui::(anonymous_namespace)::ICSImpl::ICSImpl()::_lambda()_2_,void>
            ((function<void()> *)&local_178,&local_180);
  ftxui::Ref<ftxui::ButtonOption>::Ref(&local_190);
  option_00.address_._0_1_ = local_190.owned_.border;
  option_00.address_._1_3_ = local_190._1_3_;
  option_00._0_8_ = &local_178;
  option_00.address_._4_4_ = 0;
  ftxui::Button((ConstStringRef *)&local_b8,(function<void_()> *)&local_158,option_00);
  local_191 = 0;
  local_a8._M_allocated_capacity = (size_type)&local_c8;
  local_a8._8_8_ = 2;
  std::allocator<std::shared_ptr<ftxui::ComponentBase>_>::allocator(&local_192);
  __l_00._M_len = local_a8._8_8_;
  __l_00._M_array = (iterator)local_a8._M_allocated_capacity;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
            *)&local_98,__l_00,&local_192);
  ftxui::Container::Horizontal((Container *)local_78,(Components *)&local_98);
  local_421 = 1;
  local_1f8 = (ftxui *)local_1f0;
  local_80 = (Container *)(local_78 + 0x10);
  ftxui::StringRef::StringRef(&local_220,&this->gateway_str);
  ftxui::ConstStringRef::ConstStringRef(&local_248," Gateway ");
  ftxui::Ref<ftxui::InputOption>::Ref(&local_2b0);
  ftxui::Input((ftxui *)local_1f0,&local_220,&local_248,&local_2b0);
  local_1f8 = (ftxui *)(local_1f0 + 0x10);
  ftxui::StringRef::StringRef(&local_2d8,&this->dns_1_str);
  ftxui::ConstStringRef::ConstStringRef(&local_300," DNS 1 ");
  ftxui::Ref<ftxui::InputOption>::Ref(&local_368);
  ftxui::Input((ftxui *)(local_1f0 + 0x10),&local_2d8,&local_300,&local_368);
  local_1f8 = local_1d0;
  ftxui::StringRef::StringRef(&local_390,&this->dns_2_str);
  ftxui::ConstStringRef::ConstStringRef(&local_3b8," DNS 2 ");
  ftxui::Ref<ftxui::InputOption>::Ref(&local_420);
  ftxui::Input(local_1d0,&local_390,&local_3b8,&local_420);
  local_421 = 0;
  local_1c0.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1f0;
  local_1c0.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  std::allocator<std::shared_ptr<ftxui::ComponentBase>_>::allocator(&local_422);
  __l._M_len = (size_type)
               local_1c0.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_1c0.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_1b0,__l,&local_422);
  ftxui::Container::Horizontal((Container *)(local_78 + 0x10),&local_1b0);
  local_423 = 0;
  local_58.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78;
  local_58.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  std::allocator<std::shared_ptr<ftxui::ComponentBase>_>::allocator(&local_424);
  __l_01._M_len =
       (size_type)
       local_58.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  __l_01._M_array =
       (iterator)
       local_58.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_48,__l_01,&local_424);
  ftxui::Container::Vertical((Container *)local_30,&local_48);
  ftxui::ComponentBase::Add((ComponentBase *)this,local_30);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(local_30);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_48);
  std::allocator<std::shared_ptr<ftxui::ComponentBase>_>::~allocator(&local_424);
  local_488 = &local_58;
  do {
    local_488 = local_488 + -1;
    std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(local_488);
  } while (local_488 != (shared_ptr<ftxui::ComponentBase> *)local_78);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_1b0);
  std::allocator<std::shared_ptr<ftxui::ComponentBase>_>::~allocator(&local_422);
  local_4a0 = &local_1c0;
  do {
    local_4a0 = local_4a0 + -1;
    std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(local_4a0);
  } while (local_4a0 != (shared_ptr<ftxui::ComponentBase> *)local_1f0);
  ftxui::Ref<ftxui::InputOption>::~Ref(&local_420);
  ftxui::ConstStringRef::~ConstStringRef(&local_3b8);
  ftxui::StringRef::~StringRef(&local_390);
  ftxui::Ref<ftxui::InputOption>::~Ref(&local_368);
  ftxui::ConstStringRef::~ConstStringRef(&local_300);
  ftxui::StringRef::~StringRef(&local_2d8);
  ftxui::Ref<ftxui::InputOption>::~Ref(&local_2b0);
  ftxui::ConstStringRef::~ConstStringRef(&local_248);
  ftxui::StringRef::~StringRef(&local_220);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             *)&local_98);
  std::allocator<std::shared_ptr<ftxui::ComponentBase>_>::~allocator(&local_192);
  local_4b8 = &local_a8;
  do {
    local_4b8 = local_4b8 + -1;
    std::shared_ptr<ftxui::ComponentBase>::~shared_ptr
              ((shared_ptr<ftxui::ComponentBase> *)local_4b8);
  } while (local_4b8 != &local_c8);
  std::function<void_()>::~function(&local_178);
  ftxui::ConstStringRef::~ConstStringRef(&local_158);
  std::function<void_()>::~function(&local_118);
  ftxui::ConstStringRef::~ConstStringRef(&local_f8);
  return;
}

Assistant:

ICSImpl() {
    LoadConfig();
    Add(Container::Vertical({
        Container::Horizontal({
            Button("ICS On",
                   [&] {
                     route_add_ = true;
                     route_h();
                     StoreConfig();
                   }),
            Button("ICS Off",
                   [&] {
                     route_add_ = false;
                     route_h();
                     StoreConfig();
                   }),
        }),
        Container::Horizontal({
            Input(&gateway_str, " Gateway "),
            Input(&dns_1_str, " DNS 1 "),
            Input(&dns_2_str, " DNS 2 "),
        }),
    }));
  }